

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalWrenchesEstimation.cpp
# Opt level: O0

bool iDynTree::estimateExternalWrenches
               (Model *model,SubModelDecomposition *subModels,SensorsList *sensors,
               LinkUnknownWrenchContacts *unknownWrenches,JointPosDoubleArray *jointPos,
               LinkVelArray *linkVel,LinkAccArray *linkProperAcc,
               SensorsMeasurements *ftSensorsMeasurements,estimateExternalWrenchesBuffers *bufs,
               LinkContactWrenches *outputContactWrenches)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  reference pvVar4;
  long lVar5;
  reference this;
  ulong in_RSI;
  Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>_>
  SVar6;
  DenseBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_00000008;
  ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *in_stack_00000010;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_00000018;
  Model *in_stack_00000020;
  size_t i;
  bool someResultIsNan;
  LinkVelArray *in_stack_000000f8;
  JointPosDoubleArray *in_stack_00000100;
  SensorsList *in_stack_00000108;
  Traversal *in_stack_00000110;
  Model *in_stack_00000118;
  LinkAccArray *in_stack_00000130;
  SensorsMeasurements *in_stack_00000138;
  estimateExternalWrenchesBuffers *in_stack_00000140;
  Wrench knownTerms;
  Traversal *subModelTraversal;
  size_t sm;
  double tol;
  estimateExternalWrenchesBuffers *in_stack_00000518;
  size_t in_stack_00000520;
  JointPosDoubleArray *in_stack_00000528;
  LinkUnknownWrenchContacts *in_stack_00000530;
  Traversal *in_stack_00000538;
  Model *in_stack_00000540;
  DenseBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *other;
  ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *this_00;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>_> *b;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  VectorDynSize *in_stack_fffffffffffffde8;
  MatrixDynSize *in_stack_fffffffffffffdf8;
  ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *in_stack_fffffffffffffe08;
  SpatialVector<iDynTree::SpatialForceVector> *in_stack_fffffffffffffe10;
  MatrixDynSize *local_1d0;
  LinkContactWrenches *in_stack_fffffffffffffec0;
  estimateExternalWrenchesBuffers *in_stack_fffffffffffffec8;
  size_t in_stack_fffffffffffffed0;
  LinkUnknownWrenchContacts *in_stack_fffffffffffffed8;
  Traversal *in_stack_fffffffffffffee0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  ulong local_48;
  byte local_1;
  
  iDynTree::LinkContactWrenches::resize(in_stack_00000020);
  for (local_48 = 0; uVar3 = iDynTree::SubModelDecomposition::getNrOfSubModels(), local_48 < uVar3;
      local_48 = local_48 + 1) {
    iDynTree::SubModelDecomposition::getTraversal(in_RSI);
    other = in_stack_00000008;
    this_00 = in_stack_00000010;
    b = in_stack_00000018;
    computeKnownTermsOfEstimationEquationWithInternalFT
              (in_stack_00000118,in_stack_00000110,in_stack_00000108,in_stack_00000100,
               in_stack_000000f8,in_stack_00000130,in_stack_00000138,in_stack_00000140);
    SpatialVector<iDynTree::SpatialForceVector>::asVector(in_stack_fffffffffffffe10);
    pvVar4 = std::vector<iDynTree::VectorFixSize<6U>,_std::allocator<iDynTree::VectorFixSize<6U>_>_>
             ::operator[]((vector<iDynTree::VectorFixSize<6U>,_std::allocator<iDynTree::VectorFixSize<6U>_>_>
                           *)(in_stack_00000018 + 0x30),local_48);
    pvVar4->m_data[4] = local_98;
    pvVar4->m_data[5] = dStack_90;
    pvVar4->m_data[2] = local_a8;
    pvVar4->m_data[3] = dStack_a0;
    pvVar4->m_data[0] = local_b8;
    pvVar4->m_data[1] = dStack_b0;
    computeMatrixOfEstimationEquationAndExtWrenchKnownTerms
              (in_stack_00000540,in_stack_00000538,in_stack_00000530,in_stack_00000528,
               in_stack_00000520,in_stack_00000518);
    std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
              ((vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_> *)
               in_stack_00000018,local_48);
    lVar5 = iDynTree::MatrixDynSize::rows();
    if (lVar5 != 0) {
      std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
                ((vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_> *)
                 in_stack_00000018,local_48);
      in_stack_fffffffffffffe10 =
           (SpatialVector<iDynTree::SpatialForceVector> *)iDynTree::MatrixDynSize::cols();
      if (in_stack_fffffffffffffe10 != (SpatialVector<iDynTree::SpatialForceVector> *)0x0) {
        std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::operator[]
                  ((vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_> *)
                   in_stack_00000018,local_48);
        toEigen(in_stack_fffffffffffffdf8);
        Eigen::
        MatrixBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
        colPivHouseholderQr((MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                             *)in_stack_fffffffffffffe08);
        std::vector<iDynTree::VectorFixSize<6U>,_std::allocator<iDynTree::VectorFixSize<6U>_>_>::
        operator[]((vector<iDynTree::VectorFixSize<6U>,_std::allocator<iDynTree::VectorFixSize<6U>_>_>
                    *)(in_stack_00000018 + 0x30),local_48);
        toEigen<6U>((VectorFixSize<6U> *)in_stack_fffffffffffffde8);
        SVar6 = Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,1,-1,-1>>>::
                solve<Eigen::Map<Eigen::Matrix<double,6,1,0,6,1>,0,Eigen::Stride<0,0>>>
                          ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                            *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),b);
        in_stack_fffffffffffffe08 = SVar6.m_dec;
        std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::operator[]
                  ((vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *)
                   (in_stack_00000018 + 0x18),local_48);
        toEigen(in_stack_fffffffffffffde8);
        Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                  ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)this_00,
                   other);
        Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::~ColPivHouseholderQR
                  (this_00);
      }
    }
    bVar1 = false;
    local_1d0 = (MatrixDynSize *)0x0;
    while( true ) {
      std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::operator[]
                ((vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *)
                 (in_stack_00000018 + 0x18),local_48);
      in_stack_fffffffffffffdf8 = (MatrixDynSize *)iDynTree::VectorDynSize::size();
      if (in_stack_fffffffffffffdf8 <= local_1d0) break;
      this = std::vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>::
             operator[]((vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *
                        )(in_stack_00000018 + 0x18),local_48);
      in_stack_fffffffffffffde8 =
           (VectorDynSize *)iDynTree::VectorDynSize::operator()(this,(ulong)local_1d0);
      uVar2 = std::isnan(*(double *)in_stack_fffffffffffffde8);
      in_stack_fffffffffffffde7 = (undefined1)uVar2;
      if ((uVar2 & 1) != 0) {
        bVar1 = true;
        break;
      }
      local_1d0 = local_1d0 + 1;
    }
    if (!bVar1) {
      storeResultsOfEstimation
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                 in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    }
    else {
      iDynTree::reportError
                ("","estimateExternalWrenches","NaN found in estimation result, estimation failed");
      local_1 = 0;
    }
    Wrench::~Wrench((Wrench *)0x547429);
    if (bVar1) goto LAB_00547467;
  }
  local_1 = 1;
LAB_00547467:
  return (bool)(local_1 & 1);
}

Assistant:

bool estimateExternalWrenches(const Model& model,
                              const SubModelDecomposition& subModels,
                              const SensorsList& sensors,
                              const LinkUnknownWrenchContacts& unknownWrenches,
                              const JointPosDoubleArray & jointPos,
                              const LinkVelArray& linkVel,
                              const LinkAccArray& linkProperAcc,
                              const SensorsMeasurements& ftSensorsMeasurements,
                                    estimateExternalWrenchesBuffers& bufs,
                                    LinkContactWrenches& outputContactWrenches)
{
    /**< value extracted from old iDynContact */
    double tol = 1e-7;

    // Resize the output data structure
    outputContactWrenches.resize(model);

    // Solve the problem for each submodel
    for(size_t sm=0; sm < subModels.getNrOfSubModels(); sm++ )
    {
        // Number of unknowns for this submodel
        const Traversal & subModelTraversal = subModels.getTraversal(sm);

        // First compute the known term of the estimation for each link:
        // this loop is similar to the dynamic phase of the RNEA
        // \todo pimp up performance as done in RNEADynamicPhase
        Wrench knownTerms = computeKnownTermsOfEstimationEquationWithInternalFT(model,subModelTraversal,
                                sensors,jointPos,linkVel,linkProperAcc,ftSensorsMeasurements,bufs);

        // Copy knownTerms in the buffers used for estimation
        bufs.b[sm] = knownTerms.asVector();

        // Now we compute the A matrix
        computeMatrixOfEstimationEquationAndExtWrenchKnownTerms(model,subModelTraversal,unknownWrenches,jointPos,sm,bufs);

        // If A has no unkowns then pseudoInverse can not be computed
        // In that case, we do not compute the x vector because it will have zero elements 
        if (bufs.A[sm].rows() > 0 && bufs.A[sm].cols() > 0) {
	    toEigen(bufs.x[sm]) = toEigen(bufs.A[sm]).colPivHouseholderQr().solve(toEigen(bufs.b[sm]));	    
        }

        // Check if there are any nan in the estimation results
        bool someResultIsNan = false;
        for(size_t i=0; i < bufs.x[sm].size(); i++)
        {
            if( std::isnan(bufs.x[sm](i)) )
            {
                someResultIsNan = true;
                break;
            }
        }

        if (someResultIsNan)
        {
            reportError("", "estimateExternalWrenches", "NaN found in estimation result, estimation failed");
            return false;
        }

        // We copy the estimated unknowns in the outputContactWrenches
        // Note that the logic of conversion between input/output contacts should be
        // the same used before in computeMatrixOfEstimationEquation
        storeResultsOfEstimation(subModelTraversal,unknownWrenches,sm,bufs,outputContactWrenches);
    }

    return true;
}